

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWCamera.cpp
# Opt level: O0

void __thiscall COLLADAFW::Camera::Camera(Camera *this,UniqueId *uniqueId)

{
  undefined8 *in_RDI;
  UniqueId *in_stack_ffffffffffffffa8;
  undefined8 *value;
  AnimatableFloat *in_stack_ffffffffffffffb0;
  AnimatableFloat *this_00;
  
  ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)390>::ObjectTemplate
            ((ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)390> *)in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  *in_RDI = &PTR__Camera_00e6c888;
  std::__cxx11::string::string((string *)(in_RDI + 4));
  std::__cxx11::string::string((string *)(in_RDI + 8));
  *(undefined4 *)(in_RDI + 0xc) = 0;
  *(undefined4 *)((long)in_RDI + 100) = 0;
  AnimatableFloat::AnimatableFloat(in_stack_ffffffffffffffb0,(double)in_stack_ffffffffffffffa8);
  AnimatableFloat::AnimatableFloat(in_stack_ffffffffffffffb0,(double)in_stack_ffffffffffffffa8);
  this_00 = (AnimatableFloat *)(in_RDI + 0x17);
  AnimatableFloat::AnimatableFloat(this_00,(double)in_stack_ffffffffffffffa8);
  value = in_RDI + 0x1c;
  AnimatableFloat::AnimatableFloat(this_00,(double)value);
  AnimatableFloat::AnimatableFloat(this_00,(double)value);
  return;
}

Assistant:

Camera::Camera( const UniqueId& uniqueId)
		: ObjectTemplate< COLLADA_TYPE::CAMERA >(uniqueId)
		, mCameraType(UNDEFINED_CAMERATYPE)
		, mDescriptionType( UNDEFINED )
		, mXFovOrXMag(0)
		, mYFovOrYMag(0)
		, mAspectRatio(0)
		, mNearClippingPlane(0)
		, mFarClippingPlane(0)
	{
	}